

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void STATE_board_print_debug(chess_state_t *s)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  
  for (iVar2 = 7; -1 < iVar2; iVar2 = iVar2 + -1) {
    fprintf(_stdout,"#%c ",(ulong)(iVar2 + 0x31));
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar3 = 1L << (((byte)lVar4 | (char)iVar2 * '\b') & 0x3f);
      cVar6 = '-';
      for (lVar5 = 0; lVar5 != 0x70; lVar5 = lVar5 + 0x38) {
        cVar1 = cVar6;
        if ((*(ulong *)((long)s->bitboard + lVar5 + 0x30) & uVar3) != 0) {
          if ((*(ulong *)((long)s->bitboard + lVar5) & uVar3) != 0) {
            cVar6 = 'P';
          }
          if ((*(ulong *)((long)s->bitboard + lVar5 + 8) & uVar3) != 0) {
            cVar6 = 'N';
          }
          if ((*(ulong *)((long)s->bitboard + lVar5 + 0x10) & uVar3) != 0) {
            cVar6 = 'B';
          }
          if ((*(ulong *)((long)s->bitboard + lVar5 + 0x18) & uVar3) != 0) {
            cVar6 = 'R';
          }
          if ((*(ulong *)((long)s->bitboard + lVar5 + 0x20) & uVar3) != 0) {
            cVar6 = 'Q';
          }
          if ((*(ulong *)((long)s->bitboard + lVar5 + 0x28) & uVar3) != 0) {
            cVar6 = 'K';
          }
          cVar1 = cVar6 + ' ';
          if (lVar5 != 0x38) {
            cVar1 = cVar6;
          }
        }
        cVar6 = cVar1;
      }
      fprintf(_stdout,"%c ",(ulong)(uint)(int)cVar6);
    }
    fputc(10,_stdout);
  }
  fwrite("   A B C D E F G H\n",0x13,1,_stdout);
  return;
}

Assistant:

void STATE_board_print_debug(const chess_state_t *s)
{
    int rank, file, color;
    for(rank = 7; rank >= 0; rank--) {
        fprintf(stdout, "#%c ", rank + '1');
        for(file = 0; file < 8; file++) {
            char c = '-';
            for(color = WHITE; color <= BLACK; color++) {
                if(s->bitboard[color*NUM_TYPES+ALL] & BITBOARD_RANK_FILE(rank, file)) {
                    if(s->bitboard[color*NUM_TYPES+PAWN] & BITBOARD_RANK_FILE(rank, file)) c = 'P';
                    if(s->bitboard[color*NUM_TYPES+KNIGHT] & BITBOARD_RANK_FILE(rank, file)) c = 'N';
                    if(s->bitboard[color*NUM_TYPES+BISHOP] & BITBOARD_RANK_FILE(rank, file)) c = 'B';
                    if(s->bitboard[color*NUM_TYPES+ROOK] & BITBOARD_RANK_FILE(rank, file)) c = 'R';
                    if(s->bitboard[color*NUM_TYPES+QUEEN] & BITBOARD_RANK_FILE(rank, file)) c = 'Q';
                    if(s->bitboard[color*NUM_TYPES+KING] & BITBOARD_RANK_FILE(rank, file)) c = 'K';
                    if(color == BLACK) c += 32;
                }
            }
            fprintf(stdout, "%c ", c);
        }
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "   A B C D E F G H\n");
}